

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int JsUtil::
    BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::GetNextFreeEntryIndex(EntryType *freeEntry)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if (-2 < (freeEntry->
           super_DefaultHashedEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           ).super_KeyValueEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>.
           super_ValueEntry<Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>_>
           .super_KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>.
           next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x32a,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return -2 - (freeEntry->
              super_DefaultHashedEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              ).super_KeyValueEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>.
              super_ValueEntry<Memory::Recycler::TrackerItem_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>_>
              .
              super_KeyValueEntryDataLayout2<const_std::type_info_*,_Memory::Recycler::TrackerItem_*>
              .next;
}

Assistant:

static int GetNextFreeEntryIndex(const EntryType &freeEntry)
        {
            Assert(IsFreeEntry(freeEntry));
            return FreeListSentinel - freeEntry.next;
        }